

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

int32 vector_maxcomp_float32(float32 *val,int32 len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  for (uVar3 = 1; (long)uVar3 < (long)len; uVar3 = uVar3 + 1) {
    uVar1 = uVar3 & 0xffffffff;
    if ((float)val[uVar3] < (float)val[(int32)uVar2] ||
        (float)val[uVar3] == (float)val[(int32)uVar2]) {
      uVar1 = uVar2;
    }
    uVar2 = uVar1;
  }
  return (int32)uVar2;
}

Assistant:

int32
vector_maxcomp_float32(float32 * val, int32 len)
{
    int32 i, bi;

    bi = 0;
    for (i = 1; i < len; i++) {
        if (val[i] > val[bi])
            bi = i;
    }
    return bi;
}